

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_landscape_on_grid.h
# Opt level: O3

void __thiscall
Gudhi::Persistence_representations::Persistence_landscape_on_grid::Persistence_landscape_on_grid
          (Persistence_landscape_on_grid *this,char *filename,size_t number_of_points_,
          uint number_of_levels_of_landscape,uint16_t dimension)

{
  pointer ppVar1;
  pointer ppVar2;
  pointer ppVar3;
  double *pdVar4;
  undefined2 in_register_00000082;
  long lVar5;
  double grid_min_;
  double grid_max_;
  double dVar6;
  double dVar7;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> p;
  allocator<char> local_89;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> local_88;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> local_68;
  string local_50;
  
  (this->values_of_landscapes).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->values_of_landscapes).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->values_of_landscapes).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  if (CONCAT22(in_register_00000082,dimension) == 0xffff) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,filename,&local_89);
    read_persistence_intervals_in_one_dimension_from_file(&local_88,&local_50,-1,-1.0);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,filename,&local_89);
    read_persistence_intervals_in_one_dimension_from_file
              (&local_88,&local_50,CONCAT22(in_register_00000082,dimension),-1.0);
  }
  ppVar3 = local_88.
           super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  ppVar2 = local_88.
           super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ppVar1 = local_88.
           super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_68.
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl
  .super__Vector_impl_data._M_start =
       local_88.
       super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_68.
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl
  .super__Vector_impl_data._M_finish =
       local_88.
       super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_68.
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage =
       local_88.
       super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_88.
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((long)ppVar2 - (long)ppVar1 == 0) {
    grid_max_ = -1.79769313486232e+308;
    grid_min_ = 1.79769313486232e+308;
  }
  else {
    lVar5 = (long)ppVar2 - (long)ppVar1 >> 4;
    pdVar4 = &ppVar1->second;
    dVar6 = -1.79769313486232e+308;
    dVar7 = 1.79769313486232e+308;
    do {
      grid_min_ = ((pair<double,_double> *)(pdVar4 + -1))->first;
      if (dVar7 <= ((pair<double,_double> *)(pdVar4 + -1))->first) {
        grid_min_ = dVar7;
      }
      grid_max_ = *pdVar4;
      if (*pdVar4 <= dVar6) {
        grid_max_ = dVar6;
      }
      pdVar4 = pdVar4 + 2;
      lVar5 = lVar5 + -1;
      dVar6 = grid_max_;
      dVar7 = grid_min_;
    } while (lVar5 != 0);
  }
  set_up_values_of_landscapes
            (this,&local_68,grid_min_,grid_max_,number_of_points_,number_of_levels_of_landscape);
  if (ppVar1 != (pointer)0x0) {
    operator_delete(ppVar1,(long)ppVar3 - (long)ppVar1);
  }
  return;
}

Assistant:

Persistence_landscape_on_grid::Persistence_landscape_on_grid(const char* filename, size_t number_of_points_,
                                                             unsigned number_of_levels_of_landscape,
                                                             uint16_t dimension) {
  std::vector<std::pair<double, double> > p;
  if (dimension == std::numeric_limits<uint16_t>::max()) {
    p = read_persistence_intervals_in_one_dimension_from_file(filename);
  } else {
    p = read_persistence_intervals_in_one_dimension_from_file(filename, dimension);
  }
  double grid_min_ = std::numeric_limits<double>::max();
  double grid_max_ = -std::numeric_limits<double>::max();
  for (size_t i = 0; i != p.size(); ++i) {
    if (p[i].first < grid_min_) grid_min_ = p[i].first;
    if (p[i].second > grid_max_) grid_max_ = p[i].second;
  }
  this->set_up_values_of_landscapes(p, grid_min_, grid_max_, number_of_points_, number_of_levels_of_landscape);
}